

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRBlock * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::allocate<spirv_cross::SPIRBlock&>
          (ObjectPool<spirv_cross::SPIRBlock> *this,SPIRBlock *p)

{
  Vector<spirv_cross::SPIRBlock_*> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  Hints HVar3;
  BlockID BVar4;
  BlockID BVar5;
  BlockID BVar6;
  ID IVar7;
  ID IVar8;
  BlockID BVar9;
  BlockID BVar10;
  BlockID BVar11;
  ID IVar12;
  bool bVar13;
  bool bVar14;
  undefined1 uVar15;
  _Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  _Var16;
  _Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> _Var17;
  size_t sVar18;
  ulong uVar19;
  SPIRBlock *pSVar20;
  
  this_00 = &this->vacants;
  sVar18 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
  if (sVar18 == 0) {
    sVar18 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
             .buffer_size;
    uVar19 = (ulong)(this->start_object_count << ((byte)sVar18 & 0x1f));
    _Var16.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>)malloc(uVar19 * 0x3d0);
    if (_Var16.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl ==
        (SPIRBlock *)0x0) {
      return (SPIRBlock *)0x0;
    }
    if (uVar19 != 0) {
      sVar18 = 0;
      _Var17._M_head_impl =
           (SPIRBlock *)_Var16.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRBlock_*,_0UL>::reserve(this_00,sVar18 + 1);
        sVar18 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar18] = _Var17._M_head_impl
        ;
        sVar18 = sVar18 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = sVar18;
        _Var17._M_head_impl = _Var17._M_head_impl + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
      sVar18 = (this->memory).
               super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
               .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar18 + 1);
    sVar18 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
             .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
    .ptr[sVar18]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> =
         _Var16.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
    .buffer_size = sVar18 + 1;
    sVar18 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
    pSVar20 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar18 - 1];
    if (sVar18 == 0) goto LAB_0034889c;
  }
  else {
    pSVar20 = (this_00->super_VectorView<spirv_cross::SPIRBlock_*>).ptr[sVar18 - 1];
  }
  SmallVector<spirv_cross::SPIRBlock_*,_0UL>::resize(this_00,sVar18 - 1);
LAB_0034889c:
  (pSVar20->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar20->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRBlock_003fa9c8;
  HVar3 = p->hint;
  BVar4.id = (p->next_block).id;
  BVar5.id = (p->merge_block).id;
  BVar6.id = (p->continue_block).id;
  IVar7.id = (p->return_value).id;
  IVar8.id = (p->condition).id;
  BVar9.id = (p->true_block).id;
  BVar10.id = (p->false_block).id;
  BVar11.id = (p->default_block).id;
  IVar12.id = (p->mesh).groups[0].id;
  uVar1 = *(undefined8 *)(p->mesh).groups;
  uVar2 = *(undefined8 *)((p->mesh).groups + 2);
  *(undefined8 *)&(pSVar20->super_IVariant).field_0xc =
       *(undefined8 *)&(p->super_IVariant).field_0xc;
  pSVar20->hint = HVar3;
  pSVar20->next_block = (BlockID)BVar4.id;
  pSVar20->merge_block = (BlockID)BVar5.id;
  pSVar20->continue_block = (BlockID)BVar6.id;
  pSVar20->return_value = (ID)IVar7.id;
  pSVar20->condition = (ID)IVar8.id;
  pSVar20->true_block = (BlockID)BVar9.id;
  pSVar20->false_block = (BlockID)BVar10.id;
  pSVar20->default_block = (BlockID)BVar11.id;
  (pSVar20->mesh).groups[0] = (ID)IVar12.id;
  *(undefined8 *)(pSVar20->mesh).groups = uVar1;
  *(undefined8 *)((pSVar20->mesh).groups + 2) = uVar2;
  (pSVar20->ops).super_VectorView<spirv_cross::Instruction>.buffer_size = 0;
  (pSVar20->ops).super_VectorView<spirv_cross::Instruction>.ptr =
       (Instruction *)&(pSVar20->ops).stack_storage;
  (pSVar20->ops).buffer_capacity = 8;
  SmallVector<spirv_cross::Instruction,_8UL>::operator=(&pSVar20->ops,&p->ops);
  (pSVar20->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size = 0;
  (pSVar20->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr =
       (Phi *)&(pSVar20->phi_variables).stack_storage;
  (pSVar20->phi_variables).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL>::operator=
            (&pSVar20->phi_variables,&p->phi_variables);
  (pSVar20->declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .buffer_size = 0;
  (pSVar20->declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
          *)&(pSVar20->declare_temporary).stack_storage;
  (pSVar20->declare_temporary).buffer_capacity = 8;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  ::operator=(&pSVar20->declare_temporary,&p->declare_temporary);
  (pSVar20->potential_declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .buffer_size = 0;
  (pSVar20->potential_declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
          *)&(pSVar20->potential_declare_temporary).stack_storage;
  (pSVar20->potential_declare_temporary).buffer_capacity = 8;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  ::operator=(&pSVar20->potential_declare_temporary,&p->potential_declare_temporary);
  (pSVar20->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size = 0;
  (pSVar20->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
       (Case *)&(pSVar20->cases_32bit).stack_storage;
  (pSVar20->cases_32bit).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=(&pSVar20->cases_32bit,&p->cases_32bit);
  (pSVar20->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size = 0;
  (pSVar20->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
       (Case *)&(pSVar20->cases_64bit).stack_storage;
  (pSVar20->cases_64bit).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=(&pSVar20->cases_64bit,&p->cases_64bit);
  bVar13 = p->complex_continue;
  bVar14 = p->need_ladder_break;
  uVar15 = p->field_0x31b;
  BVar4.id = (p->ignore_phi_from_block).id;
  pSVar20->disable_block_optimization = p->disable_block_optimization;
  pSVar20->complex_continue = bVar13;
  pSVar20->need_ladder_break = bVar14;
  pSVar20->field_0x31b = uVar15;
  pSVar20->ignore_phi_from_block = (BlockID)BVar4.id;
  (pSVar20->loop_dominator).id = (p->loop_dominator).id;
  (pSVar20->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = 0;
  (pSVar20->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
       = (TypedID<(spirv_cross::Types)2> *)&(pSVar20->dominated_variables).stack_storage;
  (pSVar20->dominated_variables).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
            (&pSVar20->dominated_variables,&p->dominated_variables);
  (pSVar20->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = 0;
  (pSVar20->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(pSVar20->loop_variables).stack_storage;
  (pSVar20->loop_variables).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
            (&pSVar20->loop_variables,&p->loop_variables);
  (pSVar20->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (pSVar20->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar20->invalidate_expressions).stack_storage;
  (pSVar20->invalidate_expressions).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar20->invalidate_expressions,&p->invalidate_expressions);
  return pSVar20;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}